

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall wabt::interp::Thread::DoSimdSwizzle(Thread *this)

{
  uchar uVar1;
  Simd<unsigned_char,_(unsigned_char)__x10_> value;
  byte *pbVar2;
  uchar *puVar3;
  byte local_41;
  undefined1 auStack_40 [7];
  u8 i;
  S result;
  Simd<unsigned_char,_(unsigned_char)__x10_> lhs;
  Simd<unsigned_char,_(unsigned_char)__x10_> rhs;
  Thread *this_local;
  
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this);
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this);
  for (local_41 = 0; local_41 < 0x10; local_41 = local_41 + 1) {
    pbVar2 = Simd<unsigned_char,_(unsigned_char)'\x10'>::operator[]
                       ((Simd<unsigned_char,_(unsigned_char)__x10_> *)(lhs.v + 8),local_41);
    if (*pbVar2 < 0x10) {
      puVar3 = Simd<unsigned_char,_(unsigned_char)'\x10'>::operator[]
                         ((Simd<unsigned_char,_(unsigned_char)__x10_> *)(lhs.v + 8),local_41);
      puVar3 = Simd<unsigned_char,_(unsigned_char)'\x10'>::operator[]
                         ((Simd<unsigned_char,_(unsigned_char)__x10_> *)(result.v + 8),*puVar3);
      uVar1 = *puVar3;
    }
    else {
      uVar1 = '\0';
    }
    puVar3 = Simd<unsigned_char,_(unsigned_char)'\x10'>::operator[]
                       ((Simd<unsigned_char,_(unsigned_char)__x10_> *)auStack_40,local_41);
    *puVar3 = uVar1;
  }
  value.v[8] = result.v[0];
  value.v[9] = result.v[1];
  value.v[10] = result.v[2];
  value.v[0xb] = result.v[3];
  value.v[0xc] = result.v[4];
  value.v[0xd] = result.v[5];
  value.v[0xe] = result.v[6];
  value.v[0xf] = result.v[7];
  value.v[0] = auStack_40[0];
  value.v[1] = auStack_40[1];
  value.v[2] = auStack_40[2];
  value.v[3] = auStack_40[3];
  value.v[4] = auStack_40[4];
  value.v[5] = auStack_40[5];
  value.v[6] = auStack_40[6];
  value.v[7] = i;
  Push<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdSwizzle() {
  using S = u8x16;
  auto rhs = Pop<S>();
  auto lhs = Pop<S>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result[i] = rhs[i] < S::lanes ? lhs[rhs[i]] : 0;
  }
  Push(result);
  return RunResult::Ok;
}